

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O2

bool __thiscall ON_Surface::IsCone(ON_Surface *this,ON_Cone *cone,double tolerance)

{
  ON_PlaneEquation *this_00;
  uint uVar1;
  ON_3dPoint p;
  ON_3dPoint p_00;
  ON_3dPoint P_00;
  ON_3dPoint P_01;
  ON_3dPoint P_02;
  ON_3dPoint P_03;
  ON_3dPoint P_04;
  ON_3dPoint p_01;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ON_RevSurface *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *memblock;
  long lVar9;
  ulong uVar10;
  ON_Plane *pOVar11;
  ON_Arc *pOVar12;
  ON_Cone *pOVar13;
  byte bVar14;
  uint uVar15;
  byte bVar16;
  ulong uVar17;
  double extraout_XMM0_Qa;
  double dVar18;
  double dVar19;
  double dVar20;
  double tolerance_00;
  double dVar21;
  double dVar22;
  double local_228;
  ON_Line line;
  ON_3dPoint P;
  ON_Cone local_178;
  ON_3dVector local_e0;
  ON_Arc arc;
  ON_Curve *pOVar8;
  
  bVar16 = 0;
  bVar2 = ON_IsValid(tolerance);
  dVar21 = tolerance;
  if (!bVar2) {
    dVar21 = 2.3283064365386963e-10;
  }
  dVar21 = (double)((ulong)dVar21 & -(ulong)(0.0 < tolerance));
  tolerance_00 = (double)(~-(ulong)(0.0 < tolerance) & 0x3df0000000000000 | (ulong)dVar21);
  this_01 = ON_RevSurface::Cast((ON_Object *)this);
  if (this_01 != (ON_RevSurface *)0x0) {
    bVar2 = ON_RevSurface::IsConical(this_01,cone,tolerance_00);
    return bVar2;
  }
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,1);
  arc.super_ON_Circle.plane.origin.y = dVar21;
  ON_Interval::Mid((ON_Interval *)&arc);
  iVar4 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(this,0);
  pOVar8 = (ON_Curve *)CONCAT44(extraout_var,iVar4);
  if (pOVar8 == (ON_Curve *)0x0) {
    return false;
  }
  pOVar11 = &ON_Plane::World_xy;
  pOVar12 = &arc;
  for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pOVar12->super_ON_Circle).plane.origin.x = (pOVar11->origin).x;
    pOVar11 = (ON_Plane *)((long)pOVar11 + ((ulong)bVar16 * -2 + 1) * 8);
    pOVar12 = (ON_Arc *)((long)pOVar12 + (ulong)bVar16 * -0x10 + 8);
  }
  arc.super_ON_Circle.radius = 1.0;
  arc.m_angle.m_t[0] = ON_Interval::ZeroToTwoPi.m_t[0];
  arc.m_angle.m_t[1] = ON_Interval::ZeroToTwoPi.m_t[1];
  ON_Line::ON_Line(&line);
  uVar17 = -(ulong)(2.3283064365386963e-10 < tolerance_00) & (ulong)tolerance_00;
  dVar21 = tolerance_00;
  iVar4 = (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])(pOVar8,0,&arc);
  bVar3 = (byte)iVar4;
  if ((bVar3 == 0) &&
     (iVar4 = (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])(uVar17,pOVar8),
     (char)iVar4 != '\0')) {
    ON_Curve::PointAtStart((ON_3dPoint *)&local_178,pOVar8);
    line.from.z = local_178.plane.origin.z;
    line.from.x = local_178.plane.origin.x;
    line.from.y = local_178.plane.origin.y;
    ON_Curve::PointAtEnd((ON_3dPoint *)&local_178,pOVar8);
    line.to.z = local_178.plane.origin.z;
    line.to.x = local_178.plane.origin.x;
    line.to.y = local_178.plane.origin.y;
    bVar14 = 1;
  }
  else {
    bVar14 = 0;
  }
  (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar8);
  if ((bVar3 | bVar14) == 1) {
    (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,0);
    local_178.plane.origin.x = extraout_XMM0_Qa;
    local_178.plane.origin.y = dVar21;
    ON_Interval::Mid((ON_Interval *)&local_178);
    iVar4 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(this,1);
    pOVar8 = (ON_Curve *)CONCAT44(extraout_var_00,iVar4);
    if (pOVar8 != (ON_Curve *)0x0) {
      if (bVar3 == 0) {
        iVar4 = (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])
                          (uVar17,pOVar8,0,&arc);
        bVar3 = (byte)iVar4;
      }
      else {
        bVar3 = 1;
        if (bVar14 == 0) {
          iVar4 = (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])
                            (uVar17,pOVar8);
          if ((char)iVar4 == '\0') {
            bVar14 = 0;
            goto LAB_005adb92;
          }
          ON_Curve::PointAtStart((ON_3dPoint *)&local_178,pOVar8);
          line.from.z = local_178.plane.origin.z;
          line.from.x = local_178.plane.origin.x;
          line.from.y = local_178.plane.origin.y;
          ON_Curve::PointAtEnd((ON_3dPoint *)&local_178,pOVar8);
          line.to.z = local_178.plane.origin.z;
          line.to.x = local_178.plane.origin.x;
          line.to.y = local_178.plane.origin.y;
        }
        bVar14 = 1;
      }
LAB_005adb92:
      (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar8);
      if ((bVar3 & bVar14) == 1) {
        p.y = line.from.y;
        p.x = line.from.x;
        p.z = line.from.z;
        ON_Plane::ClosestPointTo((ON_3dPoint *)&local_178,(ON_Plane *)&arc,p);
        dVar21 = ON_3dPoint::DistanceTo((ON_3dPoint *)&arc,(ON_3dPoint *)&local_178);
        p_00.y = line.to.y;
        p_00.x = line.to.x;
        p_00.z = line.to.z;
        ON_Plane::ClosestPointTo((ON_3dPoint *)&local_178,(ON_Plane *)&arc,p_00);
        dVar18 = ON_3dPoint::DistanceTo((ON_3dPoint *)&arc,(ON_3dPoint *)&local_178);
        if (2.3283064365386963e-10 < ABS(dVar21 - dVar18)) {
          this_00 = &arc.super_ON_Circle.plane.plane_equation;
          P_00.y = line.from.y;
          P_00.x = line.from.x;
          P_00.z = line.from.z;
          dVar19 = ON_PlaneEquation::ValueAt(this_00,P_00);
          P_01.y = line.to.y;
          P_01.x = line.to.x;
          P_01.z = line.to.z;
          local_228 = ON_PlaneEquation::ValueAt(this_00,P_01);
          if (2.3283064365386963e-10 < ABS(dVar19 - local_228)) {
            ON_Cone::ON_Cone(&local_178);
            local_178.height = (dVar19 * dVar18 - local_228 * dVar21) / (dVar18 - dVar21);
            bVar2 = ON_IsValid(local_178.height);
            dVar20 = local_178.height;
            if ((!bVar2) || (ABS(local_178.height) <= 2.3283064365386963e-10)) {
LAB_005adf20:
              bVar2 = false;
            }
            else {
              pOVar12 = &arc;
              pOVar13 = &local_178;
              for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pOVar13->plane).origin.x = (pOVar12->super_ON_Circle).plane.origin.x;
                pOVar12 = (ON_Arc *)((long)pOVar12 + (ulong)bVar16 * -0x10 + 8);
                pOVar13 = (ON_Cone *)((long)pOVar13 + ((ulong)bVar16 * -2 + 1) * 8);
              }
              ::operator*(&local_e0,dVar20,&local_178.plane.zaxis);
              ON_3dPoint::operator+(&P,(ON_3dPoint *)&local_178,&local_e0);
              local_178.plane.origin.z = P.z;
              local_178.plane.origin.x = P.x;
              local_178.plane.origin.y = P.y;
              ON_Plane::UpdateEquation(&local_178.plane);
              if (dVar18 <= dVar21) {
                local_228 = dVar19;
              }
              local_178.radius =
                   (double)(~-(ulong)(dVar21 < dVar18) & (ulong)dVar21 |
                           -(ulong)(dVar21 < dVar18) & (ulong)dVar18);
              local_178.height = local_228 - local_178.height;
              bVar2 = ON_Cone::IsValid(&local_178);
              dVar19 = local_178.height;
              if (!bVar2) goto LAB_005adf20;
              P_02.y = line.from.y;
              P_02.x = line.from.x;
              P_02.z = line.from.z;
              dVar20 = ON_PlaneEquation::ValueAt(&local_178.plane.plane_equation,P_02);
              dVar22 = (dVar21 + dVar18) * 7.450580596925e-09;
              if ((ABS(dVar19) * dVar22 < ABS(local_178.height * dVar21 - dVar20 * local_178.radius)
                  ) || (P_03.y = line.to.y, P_03.x = line.to.x, P_03.z = line.to.z,
                       dVar21 = ON_PlaneEquation::ValueAt(&local_178.plane.plane_equation,P_03),
                       ABS(dVar19) * dVar22 <
                       ABS(local_178.height * dVar18 - dVar21 * local_178.radius)))
              goto LAB_005adf20;
              uVar5 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,0);
              uVar6 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,1);
              memblock = onmalloc((long)(int)(uVar5 + uVar6 + 2) << 3);
              (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,0,memblock);
              lVar9 = (long)(int)uVar5 * 8;
              (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,1);
              if (tolerance_00 <= dVar22) {
                tolerance_00 = dVar22;
              }
              dVar21 = ABS(local_178.height);
              uVar17 = 0;
              if ((int)uVar6 < 1) {
                uVar6 = 0;
              }
              uVar1 = uVar5;
              if ((int)uVar5 < 1) {
                uVar1 = 0;
              }
              for (; uVar17 != uVar1; uVar17 = uVar17 + 1) {
                for (uVar7 = (uint)(uVar17 != 0); uVar7 != 5; uVar7 = uVar7 + 1) {
                  dVar18 = *(double *)((long)memblock + uVar17 * 8 + 8);
                  dVar19 = *(double *)((long)memblock + uVar17 * 8);
                  for (uVar10 = 0; uVar10 != uVar6; uVar10 = uVar10 + 1) {
                    uVar15 = (uint)(uVar10 != 0);
                    iVar4 = 4 - (uint)(uVar10 != 0);
                    while (uVar15 != 5) {
                      PointAt((ON_3dPoint *)&local_e0,this,
                              ((double)(int)(4 - uVar7) * dVar19 + (double)(int)uVar7 * dVar18) *
                              0.25,((double)iVar4 *
                                    *(double *)((long)memblock + uVar10 * 8 + lVar9 + 8) +
                                   (double)(int)uVar15 *
                                   *(double *)((long)memblock + uVar10 * 8 + lVar9 + 0x10)) * 0.25);
                      P.z = local_e0.z;
                      P.x = local_e0.x;
                      P.y = local_e0.y;
                      P_04.y = local_e0.y;
                      P_04.x = local_e0.x;
                      P_04.z = local_e0.z;
                      dVar20 = ON_PlaneEquation::ValueAt(&local_178.plane.plane_equation,P_04);
                      p_01.y = P.y;
                      p_01.x = P.x;
                      p_01.z = P.z;
                      ON_Plane::ClosestPointTo((ON_3dPoint *)&local_e0,&local_178.plane,p_01);
                      dVar22 = ON_3dPoint::DistanceTo
                                         ((ON_3dPoint *)&local_178,(ON_3dPoint *)&local_e0);
                      uVar15 = uVar15 + 1;
                      iVar4 = iVar4 + -1;
                      if (dVar21 * tolerance_00 <
                          ABS(dVar22 * local_178.height - dVar20 * local_178.radius)) {
                        onfree(memblock);
                        goto LAB_005ae201;
                      }
                    }
                  }
                }
              }
              onfree(memblock);
              if (cone != (ON_Cone *)0x0) {
                memcpy(cone,&local_178,0x90);
              }
LAB_005ae201:
              bVar2 = (long)(int)uVar5 <= (long)uVar17;
            }
            ON_Cone::~ON_Cone(&local_178);
            goto LAB_005adf33;
          }
        }
      }
    }
  }
  bVar2 = false;
LAB_005adf33:
  ON_Line::~ON_Line(&line);
  ON_Plane::~ON_Plane((ON_Plane *)&arc);
  return bVar2;
}

Assistant:

bool ON_Surface::IsCone( ON_Cone* cone, double tolerance ) const
{
  if ( !ON_IsValid(tolerance) || tolerance <= 0.0 )
    tolerance = ON_ZERO_TOLERANCE;

  const ON_RevSurface* rs = ON_RevSurface::Cast(this);
  if (rs)
  {
    return rs->IsConical(cone,tolerance) ? true : false;
  }


  ON_Curve* crv = IsoCurve(0,Domain(1).Mid());
  if ( !crv )
    return false;

  ON_Arc arc;
  ON_Line line;
  int bIsLine = 0;
  int bIsArc = crv->IsArc(0,&arc,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  if ( !bIsArc )
  {
    bIsLine = crv->IsLinear(tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
    if ( bIsLine )
    {
      line.from = crv->PointAtStart();
      line.to = crv->PointAtEnd();
    }
  }
  delete crv;
  crv = 0;
  if ( !bIsArc && !bIsLine )
    return false;

  crv = IsoCurve(1,Domain(0).Mid());
  if ( !crv )
    return false;
  if ( !bIsArc )
    bIsArc = crv->IsArc(0,&arc,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  else if ( !bIsLine )
  {
    bIsLine = crv->IsLinear(tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
    if ( bIsLine )
    {
      line.from = crv->PointAtStart();
      line.to = crv->PointAtEnd();
    }
  }
  delete crv;
  crv = 0;
  if ( !bIsArc || !bIsLine )
    return false;

  double r0 = arc.plane.origin.DistanceTo(arc.plane.ClosestPointTo(line.from));
  double r1 = arc.plane.origin.DistanceTo(arc.plane.ClosestPointTo(line.to));
  if ( fabs(r0-r1) <= ON_ZERO_TOLERANCE )
    return false;
  double h0 = arc.plane.plane_equation.ValueAt(line.from);
  double h1 = arc.plane.plane_equation.ValueAt(line.to);
  if ( fabs(h0-h1) <= ON_ZERO_TOLERANCE )
    return false;
  double tol = 0.5*ON_SQRT_EPSILON*(r0+r1);

  ON_Cone cn;
  cn.height = (h0*r1 - r0*h1)/(r1-r0);
  if ( !ON_IsValid(cn.height) || fabs(cn.height) <= ON_ZERO_TOLERANCE )
    return false;
  cn.plane = arc.plane;
  cn.plane.origin = cn.plane.origin + cn.height*cn.plane.zaxis;
  cn.plane.UpdateEquation();
  if ( r0 >= r1 )
  {
    cn.radius = r0;
    cn.height = h0-cn.height;
  }
  else
  {
    cn.radius = r1;
    cn.height = h1-cn.height;
  }
  if ( !cn.IsValid() )
    return false;
  tol *= fabs(cn.height);

  // if (r - h*cn.radius/cn.height > tolerance) return false;
  double h = cn.plane.plane_equation.ValueAt(line.from);
  if ( fabs(r0*cn.height - h*cn.radius) > tol )
    return false;
  h = cn.plane.plane_equation.ValueAt(line.to);
  if ( fabs(r1*cn.height - h*cn.radius) > tol )
    return false;

  ON_3dPoint P;
  double u, v, r;
  int sc0 = SpanCount(0);
  int sc1 = SpanCount(1);
  double* s = (double*)onmalloc( (sc0+sc1+2)*sizeof(s[0]) );
  double* t = s + (sc0+1);
  GetSpanVector(0,s);
  GetSpanVector(1,t);
  tol = 0.5*ON_SQRT_EPSILON*(r0+r1);
  if ( tol < tolerance )
    tol = tolerance;
  tol *= fabs(cn.height);
  for ( int i = 0; i < sc0; i++ )
  {
    for ( int ii = i?1:0; ii <= 4; ii++ )
    {
      u = 0.25*((4-ii)*s[i] + ii*s[i+1]);
      for ( int j = 0; j < sc1; j++ )
      {
        for ( int jj = j?1:0; jj <= 4; jj++ )
        {
          v = 0.25*((4-jj)*t[j] + jj*t[j+1]);
          P = PointAt(u,v);
          h = cn.plane.plane_equation.ValueAt(P);
          r = cn.plane.origin.DistanceTo(cn.plane.ClosestPointTo(P));
          // if (r - h*cn.radius/cn.height > tolerance) return false;
          if ( fabs(r*cn.height - h*cn.radius) > tol )
          {
            onfree(s);
            return false;
          }
        }
      }
    }
  }
  onfree(s);

  if ( cone )
  {
    *cone = cn;
  }

  return true;
}